

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void selection_handles_repeat_new_proc(Am_Object *command_obj,Am_Value *new_sel,Am_Value *param_3)

{
  bool bVar1;
  Am_Which_Sel_Direction dir_00;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Wrapper *pAVar4;
  Am_String local_f0;
  Am_Value local_e8;
  Am_Value local_d8;
  Am_Value local_c8;
  undefined1 local_b8 [8];
  Am_Value new_value;
  Am_Value local_a0;
  Am_Value local_90;
  Am_Value local_80;
  undefined1 local_70 [8];
  Am_Value_List new_list;
  undefined1 local_58 [8];
  Am_Value old_value;
  Am_Object local_38;
  Am_Object widget;
  Am_Object inter;
  bool extend;
  Am_Which_Sel_Direction dir;
  Am_Value *param_2_local;
  Am_Value *new_sel_local;
  Am_Object *command_obj_local;
  
  pAVar2 = Am_Object::Get(command_obj,0xef,3);
  dir_00 = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = Am_Object::Get(command_obj,0x1a0,3);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::Am_Object(&widget,pAVar2);
  Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)&widget);
  pAVar2 = Am_Object::Get(&local_38,0x169,0);
  Am_Value::Am_Value((Am_Value *)local_58,pAVar2);
  if (dir_00 == Am_Sel_NONE) {
    bVar1 = Am_Value::Valid(new_sel);
    if (bVar1) {
      Am_Value_List::Am_Value_List((Am_Value_List *)local_70);
      bVar1 = Am_Value_List::Test(new_sel);
      if (bVar1) {
        Am_Value_List::operator=((Am_Value_List *)local_70,new_sel);
      }
      else {
        if (new_sel->type != 0xa001) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
          poVar3 = std::operator<<(poVar3,"New value for selection_handles_repeat_new not list ");
          poVar3 = operator<<(poVar3,new_sel);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          Am_Error();
        }
        Am_Value_List::Add((Am_Value_List *)local_70,new_sel,Am_TAIL,true);
      }
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_70);
      Am_Object::Set(&local_38,0x169,pAVar4,0);
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_70);
      Am_Value::operator=(new_sel,pAVar4);
      Am_Value::Am_Value(&local_80,new_sel);
      Am_Value::Am_Value(&local_90,new_sel);
      Am_Value::Am_Value(&local_a0,(Am_Value *)local_58);
      Am_String::Am_String((Am_String *)&new_value.value,&Am_No_String);
      set_commands_for_sel
                (command_obj,&widget,&local_38,&local_80,&local_90,&local_a0,false,
                 (Am_String *)&new_value.value,Am_Sel_NONE,false);
      Am_String::~Am_String((Am_String *)&new_value.value);
      Am_Value::~Am_Value(&local_a0);
      Am_Value::~Am_Value(&local_90);
      Am_Value::~Am_Value(&local_80);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_70);
    }
    else {
      pAVar2 = Am_Object::Get(command_obj,0x169,0);
      Am_Value::Am_Value((Am_Value *)local_b8,pAVar2);
      Am_Object::Set(&local_38,0x169,(Am_Value *)local_b8,0);
      Am_Value::Am_Value(&local_c8,(Am_Value *)local_b8);
      Am_Value::Am_Value(&local_d8,(Am_Value *)local_b8);
      Am_Value::Am_Value(&local_e8,(Am_Value *)local_58);
      Am_String::Am_String(&local_f0,&Am_No_String);
      set_commands_for_sel
                (command_obj,&widget,&local_38,&local_c8,&local_d8,&local_e8,false,&local_f0,
                 Am_Sel_NONE,false);
      Am_String::~Am_String(&local_f0);
      Am_Value::~Am_Value(&local_e8);
      Am_Value::~Am_Value(&local_d8);
      Am_Value::~Am_Value(&local_c8);
      Am_Value::~Am_Value((Am_Value *)local_b8);
    }
  }
  else {
    Am_Object::Am_Object((Am_Object *)&new_list.item,command_obj);
    do_move_forward_back(&widget,&local_38,dir_00,bVar1,(Am_Object *)&new_list.item);
    Am_Object::~Am_Object((Am_Object *)&new_list.item);
  }
  Am_Value::~Am_Value((Am_Value *)local_58);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&widget);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void,
                 selection_handles_repeat_new,
                 (Am_Object command_obj, Am_Value new_sel,
                  Am_Value /* new_value */))
{
  Am_Which_Sel_Direction dir = (Am_Which_Sel_Direction)(int)command_obj.Get(
      Am_CURRENT_DIRECTION, Am_RETURN_ZERO_ON_ERROR);
  bool extend = command_obj.Get(Am_MULTI_SELECTIONS, Am_RETURN_ZERO_ON_ERROR);
  Am_Object inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  Am_Object widget = inter.Get_Owner();
  Am_Value old_value = widget.Get(Am_VALUE);
  if (dir != Am_Sel_NONE) {
    do_move_forward_back(inter, widget, dir, extend, command_obj);
  } else if (new_sel.Valid()) {
    Am_INTER_TRACE_PRINT(
        widget, "Selection handle "
                    << widget << " selective repeat; new value = " << new_sel);
    Am_Value_List new_list;
    if (Am_Value_List::Test(new_sel))
      new_list = new_sel;
    else if (new_sel.type == Am_OBJECT)
      new_list.Add(new_sel);
    else
      Am_ERROR("New value for selection_handles_repeat_new not list "
               << new_sel);
    widget.Set(Am_VALUE, new_list);
    new_sel = new_list;
    set_commands_for_sel(command_obj, inter, widget, new_sel, new_sel,
                         old_value, false);
  } else {
    Am_Value new_value = command_obj.Get(Am_VALUE);
    Am_INTER_TRACE_PRINT(widget, "Selection handle "
                                     << widget
                                     << " selective repeat; using old value = "
                                     << new_value);
    widget.Set(Am_VALUE, new_value);
    set_commands_for_sel(command_obj, inter, widget, new_value, new_value,
                         old_value, false);
  }
}